

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sst_comm.cpp
# Opt level: O3

int SMPI_Gather(void *sendbuf,int sendcount,SMPI_Datatype sendtype,void *recvbuf,int recvcount,
               SMPI_Datatype recvtype,int root,SMPI_Comm comm)

{
  _Head_base<0UL,_adios2::helper::CommImpl_*,_false> _Var1;
  Datatype DVar2;
  Datatype DVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  switch(sendtype) {
  case SMPI_INT:
    switch(recvtype) {
    case SMPI_INT:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<int>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<int>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xf])
                (_Var1._M_head_impl,sendbuf,(long)sendcount,(ulong)DVar2,recvbuf,(long)recvcount,
                 CONCAT44(extraout_var,DVar3),(ulong)(uint)root,&local_50);
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_LONG:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<int>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<long>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xf])
                (_Var1._M_head_impl,sendbuf,(long)sendcount,(ulong)DVar2,recvbuf,(long)recvcount,
                 CONCAT44(extraout_var_22,DVar3),(ulong)(uint)root,&local_50);
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_SIZE_T:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<int>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<unsigned_long>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xf])
                (_Var1._M_head_impl,sendbuf,(long)sendcount,(ulong)DVar2,recvbuf,(long)recvcount,
                 CONCAT44(extraout_var_15,DVar3),(ulong)(uint)root,&local_50);
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_CHAR:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<int>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<char>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xf])
                (_Var1._M_head_impl,sendbuf,(long)sendcount,(ulong)DVar2,recvbuf,(long)recvcount,
                 CONCAT44(extraout_var_19,DVar3),(ulong)(uint)root,&local_50);
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_BYTE:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<int>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<unsigned_char>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xf])
                (_Var1._M_head_impl,sendbuf,(long)sendcount,(ulong)DVar2,recvbuf,(long)recvcount,
                 CONCAT44(extraout_var_09,DVar3),(ulong)(uint)root,&local_50);
      if (local_50 == local_40) {
        return 0;
      }
      break;
    default:
      goto switchD_00737de5_default;
    }
    break;
  case SMPI_LONG:
    switch(recvtype) {
    case SMPI_INT:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<long>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<int>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xf])
                (_Var1._M_head_impl,sendbuf,(long)sendcount,(ulong)DVar2,recvbuf,(long)recvcount,
                 CONCAT44(extraout_var_03,DVar3),(ulong)(uint)root,&local_50);
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_LONG:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<long>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<long>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xf])
                (_Var1._M_head_impl,sendbuf,(long)sendcount,(ulong)DVar2,recvbuf,(long)recvcount,
                 CONCAT44(extraout_var_23,DVar3),(ulong)(uint)root,&local_50);
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_SIZE_T:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<long>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<unsigned_long>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xf])
                (_Var1._M_head_impl,sendbuf,(long)sendcount,(ulong)DVar2,recvbuf,(long)recvcount,
                 CONCAT44(extraout_var_17,DVar3),(ulong)(uint)root,&local_50);
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_CHAR:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<long>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<char>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xf])
                (_Var1._M_head_impl,sendbuf,(long)sendcount,(ulong)DVar2,recvbuf,(long)recvcount,
                 CONCAT44(extraout_var_21,DVar3),(ulong)(uint)root,&local_50);
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_BYTE:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<long>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<unsigned_char>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xf])
                (_Var1._M_head_impl,sendbuf,(long)sendcount,(ulong)DVar2,recvbuf,(long)recvcount,
                 CONCAT44(extraout_var_12,DVar3),(ulong)(uint)root,&local_50);
      if (local_50 == local_40) {
        return 0;
      }
      break;
    default:
      goto switchD_00737de5_default;
    }
    break;
  case SMPI_SIZE_T:
    switch(recvtype) {
    case SMPI_INT:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_long>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<int>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xf])
                (_Var1._M_head_impl,sendbuf,(long)sendcount,(ulong)DVar2,recvbuf,(long)recvcount,
                 CONCAT44(extraout_var_01,DVar3),(ulong)(uint)root,&local_50);
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_LONG:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_long>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<long>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xf])
                (_Var1._M_head_impl,sendbuf,(long)sendcount,(ulong)DVar2,recvbuf,(long)recvcount,
                 CONCAT44(extraout_var_16,DVar3),(ulong)(uint)root,&local_50);
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_SIZE_T:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_long>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<unsigned_long>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xf])
                (_Var1._M_head_impl,sendbuf,(long)sendcount,(ulong)DVar2,recvbuf,(long)recvcount,
                 CONCAT44(extraout_var_11,DVar3),(ulong)(uint)root,&local_50);
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_CHAR:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_long>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<char>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xf])
                (_Var1._M_head_impl,sendbuf,(long)sendcount,(ulong)DVar2,recvbuf,(long)recvcount,
                 CONCAT44(extraout_var_13,DVar3),(ulong)(uint)root,&local_50);
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_BYTE:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_long>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<unsigned_char>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xf])
                (_Var1._M_head_impl,sendbuf,(long)sendcount,(ulong)DVar2,recvbuf,(long)recvcount,
                 CONCAT44(extraout_var_06,DVar3),(ulong)(uint)root,&local_50);
      if (local_50 == local_40) {
        return 0;
      }
      break;
    default:
      goto switchD_00737de5_default;
    }
    break;
  case SMPI_CHAR:
    switch(recvtype) {
    case SMPI_INT:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<char>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<int>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xf])
                (_Var1._M_head_impl,sendbuf,(long)sendcount,(ulong)DVar2,recvbuf,(long)recvcount,
                 CONCAT44(extraout_var_02,DVar3),(ulong)(uint)root,&local_50);
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_LONG:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<char>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<long>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xf])
                (_Var1._M_head_impl,sendbuf,(long)sendcount,(ulong)DVar2,recvbuf,(long)recvcount,
                 CONCAT44(extraout_var_20,DVar3),(ulong)(uint)root,&local_50);
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_SIZE_T:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<char>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<unsigned_long>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xf])
                (_Var1._M_head_impl,sendbuf,(long)sendcount,(ulong)DVar2,recvbuf,(long)recvcount,
                 CONCAT44(extraout_var_14,DVar3),(ulong)(uint)root,&local_50);
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_CHAR:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<char>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<char>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xf])
                (_Var1._M_head_impl,sendbuf,(long)sendcount,(ulong)DVar2,recvbuf,(long)recvcount,
                 CONCAT44(extraout_var_18,DVar3),(ulong)(uint)root,&local_50);
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_BYTE:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<char>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<unsigned_char>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xf])
                (_Var1._M_head_impl,sendbuf,(long)sendcount,(ulong)DVar2,recvbuf,(long)recvcount,
                 CONCAT44(extraout_var_08,DVar3),(ulong)(uint)root,&local_50);
      if (local_50 == local_40) {
        return 0;
      }
      break;
    default:
      goto switchD_00737de5_default;
    }
    break;
  case SMPI_BYTE:
    switch(recvtype) {
    case SMPI_INT:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_char>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<int>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xf])
                (_Var1._M_head_impl,sendbuf,(long)sendcount,(ulong)DVar2,recvbuf,(long)recvcount,
                 CONCAT44(extraout_var_00,DVar3),(ulong)(uint)root,&local_50);
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_LONG:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_char>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<long>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xf])
                (_Var1._M_head_impl,sendbuf,(long)sendcount,(ulong)DVar2,recvbuf,(long)recvcount,
                 CONCAT44(extraout_var_10,DVar3),(ulong)(uint)root,&local_50);
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_SIZE_T:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_char>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<unsigned_long>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xf])
                (_Var1._M_head_impl,sendbuf,(long)sendcount,(ulong)DVar2,recvbuf,(long)recvcount,
                 CONCAT44(extraout_var_05,DVar3),(ulong)(uint)root,&local_50);
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_CHAR:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_char>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<char>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xf])
                (_Var1._M_head_impl,sendbuf,(long)sendcount,(ulong)DVar2,recvbuf,(long)recvcount,
                 CONCAT44(extraout_var_07,DVar3),(ulong)(uint)root,&local_50);
      if (local_50 == local_40) {
        return 0;
      }
      break;
    case SMPI_BYTE:
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_char>();
      DVar3 = adios2::helper::CommImpl::GetDatatype<unsigned_char>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xf])
                (_Var1._M_head_impl,sendbuf,(long)sendcount,(ulong)DVar2,recvbuf,(long)recvcount,
                 CONCAT44(extraout_var_04,DVar3),(ulong)(uint)root,&local_50);
      if (local_50 == local_40) {
        return 0;
      }
      break;
    default:
      goto switchD_00737de5_default;
    }
    break;
  default:
    goto switchD_00737de5_default;
  }
  operator_delete(local_50);
switchD_00737de5_default:
  return 0;
}

Assistant:

int SMPI_Gather(const void *sendbuf, int sendcount, SMPI_Datatype sendtype, void *recvbuf,
                int recvcount, SMPI_Datatype recvtype, int root, SMPI_Comm comm)
{
    int ret = 0;
    switch (sendtype)
    {
#define F(type)                                                                                    \
    ret = SMPI_Gather_Impl(static_cast<const type *>(sendbuf), sendcount, recvbuf, recvcount,      \
                           recvtype, root, comm)
        CASE_FOR_EACH_TYPE(F);
#undef F
    }
    return ret;
}